

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O0

void Gia_PolynAnalyzeXors(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Gia_Obj_t *pObj;
  Vec_Int_t *vXors;
  int Count;
  int iDriver;
  int i;
  int fVerbose_local;
  Gia_Man_t *pGia_local;
  
  vXors._0_4_ = 0;
  p = Vec_IntAlloc(100);
  if (pGia->pMuxes == (uint *)0x0) {
    printf("AIG does not have XORs extracted.\n");
  }
  else {
    if (pGia->pMuxes == (uint *)0x0) {
      __assert_fail("pGia->pMuxes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecUtil.c"
                    ,0x4e,"void Gia_PolynAnalyzeXors(Gia_Man_t *, int)");
    }
    for (Count = 0; iVar1 = Vec_IntSize(pGia->vCos), Count < iVar1; Count = Count + 1) {
      pObj = Gia_ManCo(pGia,Count);
      iVar1 = Gia_ObjFaninId0p(pGia,pObj);
      Vec_IntClear(p);
      Gia_ManIncrementTravId(pGia);
      Gia_PolynCollectXors_rec(pGia,iVar1,p);
      uVar2 = Vec_IntSize(p);
      printf("%d=%d  ",(ulong)(uint)Count,(ulong)uVar2);
      iVar1 = Vec_IntSize(p);
      vXors._0_4_ = iVar1 + (uint)vXors;
    }
    printf("Total = %d.\n",(ulong)(uint)vXors);
    Vec_IntFree(p);
  }
  return;
}

Assistant:

void Gia_PolynAnalyzeXors( Gia_Man_t * pGia, int fVerbose )
{
    int i, iDriver, Count = 0;
    Vec_Int_t * vXors = Vec_IntAlloc( 100 );
    if ( pGia->pMuxes == NULL )
    {
        printf( "AIG does not have XORs extracted.\n" );
        return;
    }
    assert( pGia->pMuxes );
    Gia_ManForEachCoDriverId( pGia, iDriver, i )
    {
        Vec_IntClear( vXors );
        Gia_ManIncrementTravId( pGia );
        Gia_PolynCollectXors_rec( pGia, iDriver, vXors );
        //printf( "%3d : ", i );
        //Vec_IntPrint( vXors );
        printf( "%d=%d  ", i, Vec_IntSize(vXors) );
        Count += Vec_IntSize(vXors);
    }
    printf( "Total = %d.\n", Count );
    Vec_IntFree( vXors );
}